

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtManifoldResult.cpp
# Opt level: O3

void __thiscall
cbtManifoldResult::addContactPoint
          (cbtManifoldResult *this,cbtVector3 *normalOnBInWorld,cbtVector3 *pointInWorld,
          cbtScalar depth)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar6;
  cbtCollisionObject *pcVar7;
  cbtCollisionObject *pcVar8;
  cbtCollisionObjectWrapper *pcVar9;
  cbtCollisionObjectWrapper *pcVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  int insertIndex;
  cbtCollisionObject *pcVar16;
  cbtCollisionObjectWrapper *pcVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  cbtScalar cVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 local_118 [16];
  float local_108 [2];
  cbtVector3 local_100;
  cbtVector3 local_f0;
  cbtScalar local_e0 [2];
  cbtScalar acStack_d8 [2];
  cbtVector3 local_d0;
  float local_c0;
  float fStack_bc;
  float afStack_b8 [2];
  cbtScalar local_b0;
  undefined1 local_ac [8];
  cbtScalar cStack_a4;
  cbtScalar cStack_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  void *local_88;
  byte bStack_80;
  undefined7 uStack_7f;
  undefined1 auStack_78 [16];
  anon_union_4_2_6ad150e0_for_cbtManifoldPoint_22 local_68;
  anon_union_4_2_42dea85c_for_cbtManifoldPoint_24 local_64;
  undefined8 uStack_60;
  float local_58;
  float local_54;
  float local_50;
  float local_48;
  float local_44;
  float local_40;
  
  cVar20 = cbtPersistentManifold::getContactBreakingThreshold(this->m_manifoldPtr);
  if (depth <= cVar20) {
    uVar1 = *(ulong *)pointInWorld->m_floats;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar1;
    this_00 = this->m_manifoldPtr;
    pcVar6 = this_00->m_body0;
    pcVar7 = this->m_body0Wrap->m_collisionObject;
    auVar19._0_4_ = (float)*(undefined8 *)normalOnBInWorld->m_floats * depth + (float)uVar1;
    auVar19._4_4_ =
         (float)((ulong)*(undefined8 *)normalOnBInWorld->m_floats >> 0x20) * depth +
         (float)(uVar1 >> 0x20);
    auVar19._8_4_ = depth * 0.0 + 0.0;
    auVar19._12_4_ = depth * 0.0 + 0.0;
    fVar11 = depth * normalOnBInWorld->m_floats[2] + pointInWorld->m_floats[2];
    auVar21._4_8_ = SUB128(ZEXT812(0),4);
    auVar21._0_4_ = fVar11;
    auVar21._12_4_ = 0;
    if (pcVar6 == pcVar7) {
      auVar26 = vmovshdup_avx(auVar19);
      fVar12 = auVar26._0_4_ - (pcVar7->m_worldTransform).m_origin.m_floats[1];
      fVar13 = auVar19._0_4_ - (pcVar7->m_worldTransform).m_origin.m_floats[0];
      uVar2 = *(undefined8 *)(pcVar7->m_worldTransform).m_basis.m_el[1].m_floats;
      fVar11 = fVar11 - (pcVar7->m_worldTransform).m_origin.m_floats[2];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(pcVar7->m_worldTransform).m_basis.m_el[0].m_floats;
      uVar3 = *(ulong *)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats;
      pcVar16 = this->m_body1Wrap->m_collisionObject;
      auVar32._0_4_ = fVar12 * (float)uVar2;
      auVar32._4_4_ = fVar12 * (float)((ulong)uVar2 >> 0x20);
      auVar32._8_4_ = fVar12 * 0.0;
      auVar32._12_4_ = fVar12 * 0.0;
      auVar36._4_4_ = fVar13;
      auVar36._0_4_ = fVar13;
      auVar36._8_4_ = fVar13;
      auVar36._12_4_ = fVar13;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar7->m_worldTransform).m_basis.m_el[1].
                                                        m_floats[2])),ZEXT416((uint)fVar13),
                                ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[0].m_floats[2]
                                       ));
      auVar26 = vfmadd213ps_fma(auVar36,auVar26,auVar32);
      auVar25._4_4_ = fVar11;
      auVar25._0_4_ = fVar11;
      auVar25._8_4_ = fVar11;
      auVar25._12_4_ = fVar11;
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar11),
                                ZEXT416((uint)(pcVar7->m_worldTransform).m_basis.m_el[2].m_floats[2]
                                       ));
      uVar14 = auVar23._0_4_;
    }
    else {
      auVar26 = vmovshdup_avx(auVar19);
      pcVar16 = this->m_body1Wrap->m_collisionObject;
      fVar12 = auVar26._0_4_ - (pcVar16->m_worldTransform).m_origin.m_floats[1];
      fVar13 = auVar19._0_4_ - (pcVar16->m_worldTransform).m_origin.m_floats[0];
      uVar2 = *(undefined8 *)(pcVar16->m_worldTransform).m_basis.m_el[1].m_floats;
      fVar11 = fVar11 - (pcVar16->m_worldTransform).m_origin.m_floats[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)(pcVar16->m_worldTransform).m_basis.m_el[0].m_floats;
      uVar3 = *(ulong *)(pcVar16->m_worldTransform).m_basis.m_el[2].m_floats;
      auVar31._0_4_ = fVar12 * (float)uVar2;
      auVar31._4_4_ = fVar12 * (float)((ulong)uVar2 >> 0x20);
      auVar31._8_4_ = fVar12 * 0.0;
      auVar31._12_4_ = fVar12 * 0.0;
      auVar35._4_4_ = fVar13;
      auVar35._0_4_ = fVar13;
      auVar35._8_4_ = fVar13;
      auVar35._12_4_ = fVar13;
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar16->m_worldTransform).m_basis.m_el[1].
                                                        m_floats[2])),ZEXT416((uint)fVar13),
                                ZEXT416((uint)(pcVar16->m_worldTransform).m_basis.m_el[0].m_floats
                                              [2]));
      auVar26 = vfmadd213ps_fma(auVar35,auVar24,auVar31);
      auVar25._4_4_ = fVar11;
      auVar25._0_4_ = fVar11;
      auVar25._8_4_ = fVar11;
      auVar25._12_4_ = fVar11;
      auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar11),
                                ZEXT416((uint)(pcVar16->m_worldTransform).m_basis.m_el[2].m_floats
                                              [2]));
      uVar14 = auVar23._0_4_;
      pcVar16 = pcVar7;
    }
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar3;
    auVar26 = vfmadd213ps_fma(auVar25,auVar34,auVar26);
    auVar23._4_8_ = SUB128(ZEXT812(0),4);
    auVar23._0_4_ = uVar14;
    auVar23._12_4_ = 0;
    local_100.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar26,auVar23);
    fVar11 = (float)uVar1 - (pcVar16->m_worldTransform).m_origin.m_floats[0];
    auVar22 = vmovshdup_avx(auVar22);
    fVar12 = auVar22._0_4_ - (pcVar16->m_worldTransform).m_origin.m_floats[1];
    uVar2 = *(undefined8 *)(pcVar16->m_worldTransform).m_basis.m_el[1].m_floats;
    fVar13 = pointInWorld->m_floats[2] - (pcVar16->m_worldTransform).m_origin.m_floats[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(pcVar16->m_worldTransform).m_basis.m_el[0].m_floats;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(pcVar16->m_worldTransform).m_basis.m_el[2].m_floats;
    iVar4 = this_00->m_cachedPoints;
    local_d0.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19,auVar21);
    auVar29._0_4_ = fVar12 * (float)uVar2;
    auVar29._4_4_ = fVar12 * (float)((ulong)uVar2 >> 0x20);
    auVar29._8_4_ = fVar12 * 0.0;
    auVar29._12_4_ = fVar12 * 0.0;
    auVar33._4_4_ = fVar11;
    auVar33._0_4_ = fVar11;
    auVar33._8_4_ = fVar11;
    auVar33._12_4_ = fVar11;
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar16->m_worldTransform).m_basis.m_el[1].
                                                      m_floats[2])),ZEXT416((uint)fVar11),
                              ZEXT416((uint)(pcVar16->m_worldTransform).m_basis.m_el[0].m_floats[2])
                             );
    auVar19 = vfmadd213ps_fma(auVar33,auVar27,auVar29);
    auVar28._4_4_ = fVar13;
    auVar28._0_4_ = fVar13;
    auVar28._8_4_ = fVar13;
    auVar28._12_4_ = fVar13;
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar13),
                              ZEXT416((uint)(pcVar16->m_worldTransform).m_basis.m_el[2].m_floats[2])
                             );
    auVar19 = vfmadd213ps_fma(auVar28,auVar30,auVar19);
    local_f0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar21,0x28);
    _local_c0 = *(undefined8 *)normalOnBInWorld->m_floats;
    afStack_b8 = *(float (*) [2])(normalOnBInWorld->m_floats + 2);
    local_118 = ZEXT816(0) << 0x20;
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    auStack_78 = SUB3216(ZEXT832(0),0) << 0x20;
    local_88 = (void *)0x0;
    bStack_80 = 0;
    uStack_7f = SUB327(ZEXT832(0),5);
    local_68.m_contactCFM = 0.0;
    local_64.m_contactERP = 0.0;
    uStack_60._0_4_ = 0.0;
    uStack_60._4_4_ = 0;
    local_e0 = *(cbtScalar (*) [2])pointInWorld->m_floats;
    acStack_d8 = *(cbtScalar (*) [2])(pointInWorld->m_floats + 2);
    local_b0 = depth;
    _local_ac = local_118;
    insertIndex = cbtPersistentManifold::getCacheEntry(this_00,(cbtManifoldPoint *)local_118);
    cVar20 = (*gCalculateCombinedFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    local_ac._0_4_ = cVar20;
    cVar20 = (*gCalculateCombinedRestitutionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a0 = cVar20;
    cVar20 = (*gCalculateCombinedRollingFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    local_ac._4_4_ = cVar20;
    cVar20 = (*gCalculateCombinedSpinningFrictionCallback)
                       (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
    cStack_a4 = cVar20;
    pcVar16 = this->m_body0Wrap->m_collisionObject;
    pcVar8 = this->m_body1Wrap->m_collisionObject;
    uVar5 = pcVar16->m_collisionFlags;
    if (((char)uVar5 < '\0') || ((pcVar8->m_collisionFlags & 0x80) != 0)) {
      local_64.m_contactERP = (*gCalculateCombinedContactDampingCallback)(pcVar16,pcVar8);
      local_68.m_contactCFM =
           (*gCalculateCombinedContactStiffnessCallback)
                     (this->m_body0Wrap->m_collisionObject,this->m_body1Wrap->m_collisionObject);
      bStack_80 = bStack_80 | 8;
      uVar5 = this->m_body0Wrap->m_collisionObject->m_collisionFlags;
    }
    if (((uVar5 >> 9 & 1) != 0) ||
       ((this->m_body1Wrap->m_collisionObject->m_collisionFlags & 0x200) != 0)) {
      bStack_80 = bStack_80 | 0x10;
    }
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(ZEXT416((uint)afStack_b8[0]),auVar15);
    if (auVar19._0_4_ <= 0.70710677) {
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fStack_bc * fStack_bc)),ZEXT416((uint)local_c0),
                                ZEXT416((uint)local_c0));
      auVar19 = vsqrtss_avx(auVar21,auVar21);
      local_40 = 1.0 / auVar19._0_4_;
      local_58 = local_40 * -fStack_bc;
      local_54 = local_c0 * local_40;
      local_40 = auVar21._0_4_ * local_40;
      local_50 = 0.0;
      local_48 = local_54 * -afStack_b8[0];
      local_44 = afStack_b8[0] * local_58;
    }
    else {
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(afStack_b8[0] * afStack_b8[0])),
                                ZEXT416((uint)fStack_bc),ZEXT416((uint)fStack_bc));
      auVar19 = vsqrtss_avx(auVar21,auVar21);
      local_48 = 1.0 / auVar19._0_4_;
      local_50 = fStack_bc * local_48;
      local_54 = local_48 * -afStack_b8[0];
      local_48 = auVar21._0_4_ * local_48;
      local_58 = 0.0;
      local_44 = local_50 * -local_c0;
      local_40 = local_54 * local_c0;
    }
    bVar18 = pcVar6 == pcVar7;
    local_98 = (&this->m_partId0)[bVar18];
    local_9c = (&this->m_partId0)[!bVar18];
    local_90 = (&this->m_index0)[bVar18];
    local_94 = (&this->m_index0)[!bVar18];
    if (insertIndex < 0) {
      insertIndex = cbtPersistentManifold::addManifoldPoint
                              (this->m_manifoldPtr,(cbtManifoldPoint *)local_118,false);
    }
    else {
      cbtPersistentManifold::replaceContactPoint
                (this->m_manifoldPtr,(cbtManifoldPoint *)local_118,insertIndex);
    }
    if (gContactAddedCallback != (ContactAddedCallback)0x0) {
      pcVar9 = this->m_body0Wrap;
      pcVar10 = this->m_body1Wrap;
      if (((pcVar9->m_collisionObject->m_collisionFlags & 8) != 0) ||
         ((pcVar10->m_collisionObject->m_collisionFlags & 8) != 0)) {
        pcVar17 = pcVar9;
        if (pcVar6 == pcVar7) {
          pcVar17 = pcVar10;
          pcVar10 = pcVar9;
        }
        (*gContactAddedCallback)
                  (this->m_manifoldPtr->m_pointCache + insertIndex,pcVar10,local_9c,local_94,pcVar17
                   ,local_98,local_90);
      }
    }
    if (gContactStartedCallback != (ContactStartedCallback)0x0 && iVar4 == 0) {
      (*gContactStartedCallback)(&this->m_manifoldPtr);
    }
  }
  return;
}

Assistant:

void cbtManifoldResult::addContactPoint(const cbtVector3& normalOnBInWorld, const cbtVector3& pointInWorld, cbtScalar depth)
{
	cbtAssert(m_manifoldPtr);
	//order in manifold needs to match

	if (depth > m_manifoldPtr->getContactBreakingThreshold()) {
		//	if (depth > m_manifoldPtr->getContactProcessingThreshold())
		return;
	}
	bool isSwapped = m_manifoldPtr->getBody0() != m_body0Wrap->getCollisionObject();
	bool isNewCollision = m_manifoldPtr->getNumContacts() == 0;

	cbtVector3 pointA = pointInWorld + normalOnBInWorld * depth;

	cbtVector3 localA;
	cbtVector3 localB;

	if (isSwapped)
	{
		localA = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}
	else
	{
		localA = m_body0Wrap->getCollisionObject()->getWorldTransform().invXform(pointA);
		localB = m_body1Wrap->getCollisionObject()->getWorldTransform().invXform(pointInWorld);
	}

	cbtManifoldPoint newPt(localA, localB, normalOnBInWorld, depth);
	newPt.m_positionWorldOnA = pointA;
	newPt.m_positionWorldOnB = pointInWorld;

	int insertIndex = m_manifoldPtr->getCacheEntry(newPt);

	newPt.m_combinedFriction = gCalculateCombinedFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRestitution = gCalculateCombinedRestitutionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedRollingFriction = gCalculateCombinedRollingFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
	newPt.m_combinedSpinningFriction = gCalculateCombinedSpinningFrictionCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_CONTACT_STIFFNESS_DAMPING))
	{
		newPt.m_combinedContactDamping1 = gCalculateCombinedContactDampingCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_combinedContactStiffness1 = gCalculateCombinedContactStiffnessCallback(m_body0Wrap->getCollisionObject(), m_body1Wrap->getCollisionObject());
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_CONTACT_STIFFNESS_DAMPING;
	}

	if ((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR) ||
		(m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_HAS_FRICTION_ANCHOR))
	{
		newPt.m_contactPointFlags |= BT_CONTACT_FLAG_FRICTION_ANCHOR;
	}

	cbtPlaneSpace1(newPt.m_normalWorldOnB, newPt.m_lateralFrictionDir1, newPt.m_lateralFrictionDir2);

	//BP mod, store contact triangles.
	if (isSwapped)
	{
		newPt.m_partId0 = m_partId1;
		newPt.m_partId1 = m_partId0;
		newPt.m_index0 = m_index1;
		newPt.m_index1 = m_index0;
	}
	else
	{
		newPt.m_partId0 = m_partId0;
		newPt.m_partId1 = m_partId1;
		newPt.m_index0 = m_index0;
		newPt.m_index1 = m_index1;
	}
	//printf("depth=%f\n",depth);
	///@todo, check this for any side effects
	if (insertIndex >= 0)
	{
		//const cbtManifoldPoint& oldPoint = m_manifoldPtr->getContactPoint(insertIndex);
		m_manifoldPtr->replaceContactPoint(newPt, insertIndex);
	}
	else
	{
		insertIndex = m_manifoldPtr->addManifoldPoint(newPt);
	}

	//User can override friction and/or restitution
	if (gContactAddedCallback &&
		//and if either of the two bodies requires custom material
		((m_body0Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK) ||
		 (m_body1Wrap->getCollisionObject()->getCollisionFlags() & cbtCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK)))
	{
		//experimental feature info, for per-triangle material etc.
		const cbtCollisionObjectWrapper* obj0Wrap = isSwapped ? m_body1Wrap : m_body0Wrap;
		const cbtCollisionObjectWrapper* obj1Wrap = isSwapped ? m_body0Wrap : m_body1Wrap;
		(*gContactAddedCallback)(m_manifoldPtr->getContactPoint(insertIndex), obj0Wrap, newPt.m_partId0, newPt.m_index0, obj1Wrap, newPt.m_partId1, newPt.m_index1);
	}

	if (gContactStartedCallback && isNewCollision)
	{
		gContactStartedCallback(m_manifoldPtr);
	}
}